

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::replace_illegal_entry_point_names(CompilerMSL *this)

{
  string *psVar1;
  bool bVar2;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
  *this_01;
  mapped_type *this_02;
  TypedID<(spirv_cross::Types)0> local_54;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_50;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  string *local_40;
  string *ep_name;
  pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint> *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
  *__range1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *illegal_func_names;
  CompilerMSL *this_local;
  
  this_00 = get_illegal_func_names_abi_cxx11_();
  this_01 = &(this->super_CompilerGLSL).super_Compiler.ir.entry_points;
  __end1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
           ::begin(this_01);
  entry = (pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint> *)
          ::std::
          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
          ::end(this_01);
  while (bVar2 = ::std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
                            ,(_Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
                              *)&entry), bVar2) {
    ep_name = (string *)
              ::std::__detail::
              _Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
              ::operator*(&__end1);
    local_40 = (string *)&(((reference)ep_name)->second).name;
    local_48._M_cur =
         (__node_type *)
         ::std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(this_00,(key_type *)local_40);
    local_50._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                   (this_00);
    bVar2 = ::std::__detail::operator!=(&local_48,&local_50);
    if (bVar2) {
      ::std::__cxx11::string::operator+=(local_40,"0");
    }
    psVar1 = local_40;
    TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)4>
              (&local_54,(TypedID<(spirv_cross::Types)4> *)ep_name);
    this_02 = ::std::
              unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
              ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_54);
    ::std::__cxx11::string::operator=((string *)this_02,psVar1);
    ::std::__detail::
    _Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void CompilerMSL::replace_illegal_entry_point_names()
{
	auto &illegal_func_names = get_illegal_func_names();

	// It is important to this before we fixup identifiers,
	// since if ep_name is reserved, we will need to fix that up,
	// and then copy alias back into entry.name after the fixup.
	for (auto &entry : ir.entry_points)
	{
		// Change both the entry point name and the alias, to keep them synced.
		string &ep_name = entry.second.name;
		if (illegal_func_names.find(ep_name) != end(illegal_func_names))
			ep_name += "0";

		ir.meta[entry.first].decoration.alias = ep_name;
	}
}